

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void compute_Zx_and_norm(update_data_conflict *data,float x,float *wref)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  int i;
  int m;
  float *w;
  int local_28;
  float local_c;
  
  iVar1 = *(int *)(*in_RDI + 8);
  local_c = in_XMM0_Da;
  if ((*(byte *)(*in_RDI + 0xac) & 1) != 0) {
    dVar2 = std::sqrt((double)(ulong)*(uint *)(in_RSI + (long)(iVar1 + 1) * 4));
    local_c = in_XMM0_Da / SUB84(dVar2,0);
  }
  for (local_28 = 1; local_28 <= iVar1; local_28 = local_28 + 1) {
    *(float *)(in_RDI[3] + (long)local_28 * 4) =
         *(float *)(in_RSI + (long)local_28 * 4) * local_c *
         *(float *)(*(long *)(*in_RDI + 0x30) + (long)local_28 * 4) +
         *(float *)(in_RDI[3] + (long)local_28 * 4);
  }
  *(float *)(in_RDI + 2) = local_c * local_c + *(float *)(in_RDI + 2);
  return;
}

Assistant:

void compute_Zx_and_norm(update_data& data, float x, float& wref)
{
  float* w = &wref;
  int m = data.ON->m;
  if (data.ON->normalize)
    x /= sqrt(w[NORM2]);

  for (int i = 1; i <= m; i++)
  {
    data.Zx[i] += w[i] * x * data.ON->D[i];
  }
  data.norm2_x += x * x;
}